

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectModel.hpp
# Opt level: O0

double __thiscall Lodtalk::Oop::decodeFloatOrInt(Oop *this)

{
  bool bVar1;
  SmallIntegerValue SVar2;
  Oop *this_local;
  
  bVar1 = isFloatOrInt(this);
  if (!bVar1) {
    __assert_fail("isFloatOrInt()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                  ,0x21e,"double Lodtalk::Oop::decodeFloatOrInt() const");
  }
  bVar1 = isSmallInteger(this);
  if (bVar1) {
    SVar2 = decodeSmallInteger(this);
    this_local = (Oop *)(double)SVar2;
  }
  else {
    this_local = (Oop *)decodeFloat(this);
  }
  return (double)this_local;
}

Assistant:

inline double decodeFloatOrInt() const
    {
        assert(isFloatOrInt());
        if (isSmallInteger())
            return (double)decodeSmallInteger();
        return decodeFloat();
    }